

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderBarrier1::verifyXFBBuffer(TessellationShaderBarrier1 *this,void *data)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TestError *this_01;
  ulong uVar5;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  if ((ulong)this->m_n_result_vertices != 0) {
    uVar5 = 0;
    do {
      iVar1 = *(int *)((long)data + (uVar5 & 0xffffffff) * 4);
      iVar4 = (int)uVar5;
      iVar2 = *(int *)((long)data + (ulong)(iVar4 + 1) * 4);
      iVar3 = *(int *)((long)data + (ulong)(iVar4 + 2) * 4);
      iVar4 = *(int *)((long)data + (ulong)(iVar4 + 3) * 4);
      if ((((iVar1 != 1) || (iVar2 != 1)) || (iVar3 != 1)) || (iVar4 != 1)) {
        local_1a8._0_8_ =
             ((this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Invalid value returned: expected:[1, 1, 1, 1]",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," retrieved: ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
        std::ostream::operator<<(this_00,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,iVar4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_130);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid rendering result",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                   ,0x1f8);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar5 = uVar5 + 4;
    } while ((ulong)this->m_n_result_vertices << 2 != uVar5);
  }
  return true;
}

Assistant:

bool TessellationShaderBarrier1::verifyXFBBuffer(const void* data)
{
	int* data_int = (int*)data;

	/* Run through all vertices */
	for (unsigned int n_vertex = 0; n_vertex < m_n_result_vertices; ++n_vertex)
	{
		int retrieved_x = data_int[n_vertex * 4];
		int retrieved_y = data_int[n_vertex * 4 + 1];
		int retrieved_z = data_int[n_vertex * 4 + 2];
		int retrieved_w = data_int[n_vertex * 4 + 3];

		if (retrieved_x != 1 || retrieved_y != 1 || retrieved_z != 1 || retrieved_w != 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value returned: expected:[1, 1, 1, 1]"
							   << " retrieved: "
							   << "[" << retrieved_x << ", " << retrieved_y << ", " << retrieved_z << ", "
							   << retrieved_w << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid rendering result");
		}
	}

	return true;
}